

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

void __thiscall
CMU462::HalfedgeMesh::rebuild
          (HalfedgeMesh *this,
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *polygons,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *vertexPositions)

{
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *vertexPositions_local;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *polygons_local;
  HalfedgeMesh *this_local;
  
  std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::clear(&this->halfedges);
  std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::clear(&this->vertices);
  std::__cxx11::list<CMU462::Edge,_std::allocator<CMU462::Edge>_>::clear(&this->edges);
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::clear(&this->faces);
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::clear(&this->boundaries);
  build(this,polygons,vertexPositions);
  return;
}

Assistant:

void HalfedgeMesh::rebuild( const vector<vector<Index> >& polygons,
      const vector<Vector3D>& vertexPositions)
  {
    // Clear old elements
    halfedges.clear();
    vertices.clear();
    edges.clear();
    faces.clear();
    boundaries.clear();

    // Create new mesh
    build( polygons, vertexPositions );
  }